

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O1

Impl<unsigned_short> * BamTools::Variant::CastFromBase<unsigned_short>(ImplBase *v)

{
  char cVar1;
  char *pcVar2;
  Impl<unsigned_short> *pIVar3;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (v == (ImplBase *)0x0) {
    pIVar3 = (Impl<unsigned_short> *)0x0;
  }
  else {
    pIVar3 = (Impl<unsigned_short> *)
             __dynamic_cast(v,&ImplBase::typeinfo,&Impl<unsigned_short>::typeinfo,0);
  }
  if (pIVar3 != (Impl<unsigned_short> *)0x0) {
    return pIVar3;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  pcVar2 = _endl<char,std::char_traits<char>>;
  cVar1 = *_endl<char,std::char_traits<char>>;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," is not a valid type","");
  std::operator+(&local_40,pcVar2 + (cVar1 == '*'),&local_60);
  std::invalid_argument::invalid_argument(this,(string *)&local_40);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static Impl<T>* CastFromBase(ImplBase* v)
    {
        // This upcast will fail if T is other than the T used
        // with the constructor of variant_t.
        Impl<T>* p = dynamic_cast<Impl<T>*>(v);
        if (p == NULL)
            throw std::invalid_argument(typeid(T).name() + std::string(" is not a valid type"));
        return p;
    }